

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  iterator iVar5;
  mapped_type *this_00;
  ostream *poVar6;
  char *pcVar7;
  _Alloc_hider _Var8;
  allocator local_5d5;
  allocator local_5d4;
  allocator local_5d3;
  allocator local_5d2;
  allocator local_5d1;
  string helpString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string entryKey;
  string buffer;
  CacheEntry e;
  string cacheFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  ostringstream error;
  ifstream fin;
  byte abStack_218 [488];
  
  std::__cxx11::string::string((string *)&cacheFile,(string *)path);
  std::__cxx11::string::append((char *)&cacheFile);
  if (internal) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&(this->Cache)._M_t);
  }
  _Var8._M_p = cacheFile._M_dataplus._M_p;
  bVar1 = cmsys::SystemTools::FileExists(cacheFile._M_dataplus._M_p);
  if (bVar1) {
    std::ifstream::ifstream(&fin,cacheFile._M_dataplus._M_p,_S_in);
    bVar1 = (abStack_218[*(long *)(_fin + -0x18)] & 5) == 0;
    if (bVar1) {
      buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
      buffer._M_string_length = 0;
      entryKey._M_dataplus._M_p = (pointer)&entryKey.field_2;
      entryKey._M_string_length = 0;
      buffer.field_2._M_local_buf[0] = '\0';
      entryKey.field_2._M_local_buf[0] = '\0';
      while ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
        helpString._M_dataplus._M_p = (pointer)&helpString.field_2;
        helpString._M_string_length = 0;
        helpString.field_2._M_local_buf[0] = '\0';
        CacheEntry::CacheEntry(&e);
        cmsys::SystemTools::GetLineFromStream((istream *)&fin,&buffer,(bool *)0x0,-1);
        for (_Var8 = buffer._M_dataplus; uVar4 = (ulong)(byte)*_Var8._M_p, uVar4 < 0x24;
            _Var8._M_p = _Var8._M_p + 1) {
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
            if ((0x800000001U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0035a0f9;
            break;
          }
        }
        while (((char)uVar4 == '/' && (((byte *)_Var8._M_p)[1] == 0x2f))) {
          if ((((byte *)_Var8._M_p)[2] == 0x5c) && (((byte *)_Var8._M_p)[3] == 0x6e)) {
            std::__cxx11::string::append((char *)&helpString);
          }
          std::__cxx11::string::append((char *)&helpString);
          cmsys::SystemTools::GetLineFromStream((istream *)&fin,&buffer,(bool *)0x0,-1);
          uVar4 = (ulong)(byte)*buffer._M_dataplus._M_p;
          _Var8 = buffer._M_dataplus;
        }
        std::__cxx11::string::string((string *)&error,"HELPSTRING",(allocator *)&local_588);
        CacheEntry::SetProperty(&e,(string *)&error,helpString._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&error);
        std::__cxx11::string::string((string *)&error,_Var8._M_p,(allocator *)&local_588);
        bVar2 = cmState::ParseCacheEntry((string *)&error,&entryKey,&e.Value,&e.Type);
        std::__cxx11::string::~string((string *)&error);
        if (bVar2) {
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&excludes->_M_t,&entryKey);
          if ((_Rb_tree_header *)iVar5._M_node == &(excludes->_M_t)._M_impl.super__Rb_tree_header) {
            if ((!internal) && (e.Type == INTERNAL)) {
              iVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&includes->_M_t,&entryKey);
              if ((_Rb_tree_header *)iVar5._M_node ==
                  &(includes->_M_t)._M_impl.super__Rb_tree_header) goto LAB_0035a0f9;
            }
            if (!internal) {
              e.Type = INTERNAL;
              std::__cxx11::string::assign((char *)&helpString);
              std::__cxx11::string::append((string *)&helpString);
              std::__cxx11::string::append((char *)&helpString);
              std::__cxx11::string::append((string *)&helpString);
              std::__cxx11::string::append((char *)&helpString);
              std::__cxx11::string::string((string *)&error,"HELPSTRING",(allocator *)&local_588);
              CacheEntry::SetProperty(&e,(string *)&error,helpString._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&error);
            }
            bVar2 = ReadPropertyEntry(this,&entryKey,&e);
            if (!bVar2) {
              e.Initialized = true;
              this_00 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                        ::operator[](&this->Cache,&entryKey);
              CacheEntry::operator=(this_00,&e);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
          poVar6 = std::operator<<((ostream *)&error,"Parse error in cache file ");
          std::operator<<(poVar6,(string *)&cacheFile);
          poVar6 = std::operator<<((ostream *)&error," on line ");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6,". Offending entry: ");
          std::operator<<(poVar6,_Var8._M_p);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(local_588._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
        }
LAB_0035a0f9:
        CacheEntry::~CacheEntry(&e);
        std::__cxx11::string::~string((string *)&helpString);
      }
      this->CacheMajorVersion = 0;
      this->CacheMinorVersion = 0;
      std::__cxx11::string::string((string *)&error,"CMAKE_CACHE_MAJOR_VERSION",(allocator *)&e);
      pcVar7 = GetInitializedCacheValue(this,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      if (pcVar7 == (char *)0x0) {
        std::__cxx11::string::string((string *)&error,"CMAKE_CACHE_MINOR_VERSION",(allocator *)&e);
        AddCacheEntry(this,(string *)&error,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&error);
        std::__cxx11::string::string((string *)&error,"CMAKE_CACHE_MAJOR_VERSION",(allocator *)&e);
        AddCacheEntry(this,(string *)&error,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&error);
      }
      else {
        e.Value._M_dataplus._M_p._0_4_ = 0;
        iVar3 = __isoc99_sscanf(pcVar7,"%u");
        if (iVar3 == 1) {
          this->CacheMajorVersion = (uint)e.Value._M_dataplus._M_p;
        }
        std::__cxx11::string::string
                  ((string *)&error,"CMAKE_CACHE_MINOR_VERSION",(allocator *)&helpString);
        pcVar7 = GetInitializedCacheValue(this,(string *)&error);
        std::__cxx11::string::~string((string *)&error);
        if (pcVar7 != (char *)0x0) {
          iVar3 = __isoc99_sscanf(pcVar7,"%u",&e);
          if (iVar3 == 1) {
            this->CacheMinorVersion = (uint)e.Value._M_dataplus._M_p;
          }
        }
      }
      std::__cxx11::string::string((string *)&error,"CMAKE_CACHEFILE_DIR",(allocator *)&e);
      pcVar7 = GetInitializedCacheValue(this,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      if (internal && pcVar7 != (char *)0x0) {
        std::__cxx11::string::string((string *)&error,(string *)path);
        std::__cxx11::string::string((string *)&e,pcVar7,(allocator *)&helpString);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)&error);
        std::__cxx11::string::append((char *)&error);
        std::__cxx11::string::append((char *)&e);
        bVar2 = cmsys::SystemTools::SameFile(&e.Value,(string *)&error);
        if (!bVar2) {
          std::__cxx11::string::string
                    ((string *)&local_410,"The current CMakeCache.txt directory ",&local_5d1);
          std::operator+(&local_3f0,&local_410,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error
                        );
          std::__cxx11::string::string
                    ((string *)&local_430," is different than the directory ",&local_5d2);
          std::operator+(&local_3d0,&local_3f0,&local_430);
          std::__cxx11::string::string((string *)&local_470,"CMAKE_CACHEFILE_DIR",&local_5d3);
          pcVar7 = GetInitializedCacheValue(this,&local_470);
          std::__cxx11::string::string((string *)&local_450,pcVar7,&local_5d4);
          std::operator+(&local_588,&local_3d0,&local_450);
          std::__cxx11::string::string
                    ((string *)&local_490,
                     " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                     ,&local_5d5);
          std::operator+(&helpString,&local_588,&local_490);
          std::__cxx11::string::~string((string *)&local_490);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
          cmSystemTools::Error(helpString._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string((string *)&helpString);
        }
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::~string((string *)&error);
      }
      std::__cxx11::string::~string((string *)&entryKey);
      std::__cxx11::string::~string((string *)&buffer);
    }
    std::ifstream::~ifstream(&fin);
  }
  else {
    CleanCMakeFiles((cmCacheManager *)_Var8._M_p,path);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&cacheFile);
  return bVar1;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path, bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  // clear the old cache, if we are reading in internal values
  if (internal) {
    this->Cache.clear();
  }
  if (!cmSystemTools::FileExists(cacheFile.c_str())) {
    this->CleanCMakeFiles(path);
    return false;
  }

  cmsys::ifstream fin(cacheFile.c_str());
  if (!fin) {
    return false;
  }
  const char* realbuffer;
  std::string buffer;
  std::string entryKey;
  unsigned int lineno = 0;
  while (fin) {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    lineno++;
    realbuffer = buffer.c_str();
    while (*realbuffer != '0' &&
           (*realbuffer == ' ' || *realbuffer == '\t' || *realbuffer == '\r' ||
            *realbuffer == '\n')) {
      if (*realbuffer == '\n') {
        lineno++;
      }
      realbuffer++;
    }
    // skip blank lines and comment lines
    if (realbuffer[0] == '#' || realbuffer[0] == 0) {
      continue;
    }
    while (realbuffer[0] == '/' && realbuffer[1] == '/') {
      if ((realbuffer[2] == '\\') && (realbuffer[3] == 'n')) {
        helpString += "\n";
        helpString += &realbuffer[4];
      } else {
        helpString += &realbuffer[2];
      }
      cmSystemTools::GetLineFromStream(fin, buffer);
      lineno++;
      realbuffer = buffer.c_str();
      if (!fin) {
        continue;
      }
    }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if (cmState::ParseCacheEntry(realbuffer, entryKey, e.Value, e.Type)) {
      if (excludes.find(entryKey) == excludes.end()) {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if (internal || (e.Type != cmStateEnums::INTERNAL) ||
            (includes.find(entryKey) != includes.end())) {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal) {
            e.Type = cmStateEnums::INTERNAL;
            helpString = "DO NOT EDIT, ";
            helpString += entryKey;
            helpString += " loaded from external file.  "
                          "To change this value edit this file: ";
            helpString += path;
            helpString += "/CMakeCache.txt";
            e.SetProperty("HELPSTRING", helpString.c_str());
          }
          if (!this->ReadPropertyEntry(entryKey, e)) {
            e.Initialized = true;
            this->Cache[entryKey] = e;
          }
        }
      }
    } else {
      std::ostringstream error;
      error << "Parse error in cache file " << cacheFile;
      error << " on line " << lineno << ". Offending entry: " << realbuffer;
      cmSystemTools::Error(error.str().c_str());
    }
  }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if (const char* cmajor =
        this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION")) {
    unsigned int v = 0;
    if (sscanf(cmajor, "%u", &v) == 1) {
      this->CacheMajorVersion = v;
    }
    if (const char* cminor =
          this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION")) {
      if (sscanf(cminor, "%u", &v) == 1) {
        this->CacheMinorVersion = v;
      }
    }
  } else {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
  }
  // check to make sure the cache directory has not
  // been moved
  const char* oldDir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir) {
    std::string currentcwd = path;
    std::string oldcwd = oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if (!cmSystemTools::SameFile(oldcwd, currentcwd)) {
      std::string message =
        std::string("The current CMakeCache.txt directory ") + currentcwd +
        std::string(" is different than the directory ") +
        std::string(this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) +
        std::string(" where CMakeCache.txt was created. This may result "
                    "in binaries being created in the wrong place. If you "
                    "are not sure, reedit the CMakeCache.txt");
      cmSystemTools::Error(message.c_str());
    }
  }
  return true;
}